

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O3

uint64_t __thiscall llvm::hashing::detail::hash_state::finalize(hash_state *this,size_t length)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (this->h3 ^ this->h5) * -0x622015f714c7d297;
  uVar1 = (uVar1 >> 0x2f ^ this->h5 ^ uVar1) * -0x622015f714c7d297;
  uVar2 = (this->h4 ^ this->h6) * -0x622015f714c7d297;
  uVar2 = (uVar2 >> 0x2f ^ this->h6 ^ uVar2) * -0x622015f714c7d297;
  uVar2 = (length >> 0x2f ^ length) * -0x4b6d499041670d8d + this->h0 +
          (uVar2 >> 0x2f ^ uVar2) * -0x622015f714c7d297;
  uVar1 = ((this->h1 >> 0x2f ^ this->h1) * -0x4b6d499041670d8d + this->h2 +
           (uVar1 >> 0x2f ^ uVar1) * -0x622015f714c7d297 ^ uVar2) * -0x622015f714c7d297;
  uVar1 = (uVar1 >> 0x2f ^ uVar2 ^ uVar1) * -0x622015f714c7d297;
  return (uVar1 >> 0x2f ^ uVar1) * -0x622015f714c7d297;
}

Assistant:

uint64_t finalize(size_t length) {
    return hash_16_bytes(hash_16_bytes(h3, h5) + shift_mix(h1) * k1 + h2,
                         hash_16_bytes(h4, h6) + shift_mix(length) * k1 + h0);
  }